

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enc.c
# Opt level: O2

int TTransform(uint8_t *in,uint16_t *w)

{
  int iVar1;
  undefined4 uVar2;
  undefined7 uVar3;
  ulong uVar4;
  int iVar5;
  long lVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  ushort uVar12;
  byte bVar16;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar17 [16];
  short sVar18;
  ushort uVar23;
  undefined1 auVar19 [16];
  short sVar24;
  undefined1 auVar22 [16];
  int tmp [16];
  ushort uVar13;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  
  for (lVar6 = 0; lVar6 != 0x40; lVar6 = lVar6 + 0x10) {
    uVar2 = *(undefined4 *)(in + lVar6 * 2);
    bVar16 = (byte)((uint)uVar2 >> 0x18);
    uVar3 = CONCAT25((short)(((uint7)bVar16 << 0x30) >> 0x28),
                     CONCAT14((char)((uint)uVar2 >> 0x10),uVar2));
    uVar13 = (ushort)uVar2;
    uVar4 = (ulong)CONCAT43((int)(CONCAT34((int3)((uint7)uVar3 >> 0x20),uVar2) >> 0x18),
                            CONCAT12((char)((uint)uVar2 >> 8),uVar13)) & 0xffffffff00ffffff;
    uVar12 = uVar13 & 0xff;
    auVar14._8_8_ = 0;
    auVar14._0_8_ = CONCAT62((int6)(uVar4 >> 0x10),uVar13) & 0xffffffffffff00ff;
    sVar18 = (short)((uint7)uVar3 >> 0x20);
    auVar19._0_2_ = sVar18 + uVar12;
    sVar24 = (short)(uVar4 >> 0x10);
    uVar13 = (ushort)bVar16;
    uVar23 = sVar24 + uVar13;
    auVar20._0_10_ = (unkuint10)uVar23 << 0x30;
    auVar21._0_12_ = ZEXT212(uVar23) << 0x30;
    auVar17._0_2_ = sVar18 - uVar12;
    auVar17._2_2_ = uVar13 - sVar24;
    auVar17._4_2_ = uVar12 - sVar18;
    auVar17._6_2_ = sVar24 - uVar13;
    auVar17._8_8_ = 0;
    auVar21._12_2_ = uVar23;
    auVar21._14_2_ = auVar17._6_2_;
    auVar20._12_4_ = auVar21._12_4_;
    auVar20._10_2_ = auVar17._4_2_;
    auVar19._8_8_ = (undefined8)(CONCAT64(auVar20._10_6_,CONCAT22(uVar12 + sVar18,uVar23)) >> 0x10);
    auVar19._6_2_ = auVar17._2_2_;
    auVar19._4_2_ = uVar13 + sVar24;
    auVar19._2_2_ = auVar17._0_2_;
    auVar14 = pshuflw(auVar14,auVar19,0xe8);
    auVar14 = pshufhw(auVar14,auVar14,0xe7);
    auVar15._0_4_ = auVar14._0_4_;
    auVar15._8_4_ = auVar14._8_4_;
    auVar15._12_4_ = auVar14._12_4_;
    auVar15._4_4_ = auVar15._8_4_;
    auVar17 = pshuflw(auVar17,auVar15,0x39);
    auVar14 = pshuflw(auVar15,auVar15,0x6c);
    auVar22._0_2_ = auVar17._0_2_ + auVar14._0_2_;
    sVar24 = auVar17._6_2_ + auVar14._6_2_;
    auVar22._8_8_ =
         (undefined8)
         (CONCAT64(CONCAT42(CONCAT22(auVar17._6_2_ - auVar14._6_2_,sVar24),
                            auVar17._4_2_ - auVar14._4_2_),
                   CONCAT22(auVar17._4_2_ + auVar14._4_2_,sVar24)) >> 0x10);
    auVar22._6_2_ = auVar17._2_2_ - auVar14._2_2_;
    auVar22._4_2_ = auVar17._2_2_ + auVar14._2_2_;
    auVar22._2_2_ = auVar17._0_2_ - auVar14._0_2_;
    auVar14 = pshuflw(auVar14,auVar22,0xa0);
    *(int *)((long)tmp + lVar6) = auVar14._0_4_ >> 0x10;
    *(int *)((long)tmp + lVar6 + 4) = auVar14._4_4_ >> 0x10;
    *(int *)((long)tmp + lVar6 + 8) = auVar14._8_4_ >> 0x10;
    *(int *)((long)tmp + lVar6 + 0xc) = auVar14._12_4_ >> 0x10;
  }
  iVar5 = 0;
  for (lVar6 = 0; lVar6 != 4; lVar6 = lVar6 + 1) {
    iVar7 = tmp[lVar6 + 8] + tmp[lVar6];
    iVar11 = tmp[lVar6 + 0xc] + tmp[lVar6 + 4];
    iVar10 = tmp[lVar6 + 4] - tmp[lVar6 + 0xc];
    iVar8 = tmp[lVar6] - tmp[lVar6 + 8];
    iVar9 = iVar11 + iVar7;
    iVar1 = iVar10 + iVar8;
    iVar8 = iVar8 - iVar10;
    iVar7 = iVar7 - iVar11;
    iVar11 = -iVar9;
    if (0 < iVar9) {
      iVar11 = iVar9;
    }
    iVar9 = -iVar1;
    if (0 < iVar1) {
      iVar9 = iVar1;
    }
    iVar1 = -iVar8;
    if (0 < iVar8) {
      iVar1 = iVar8;
    }
    iVar8 = -iVar7;
    if (0 < iVar7) {
      iVar8 = iVar7;
    }
    iVar5 = iVar8 * (uint)w[lVar6 + 0xc] +
            iVar1 * (uint)w[lVar6 + 8] + iVar9 * (uint)w[lVar6 + 4] +
            iVar11 * (uint)w[lVar6] + iVar5;
  }
  return iVar5;
}

Assistant:

static int TTransform(const uint8_t* WEBP_RESTRICT in,
                      const uint16_t* WEBP_RESTRICT w) {
  int sum = 0;
  int tmp[16];
  int i;
  // horizontal pass
  for (i = 0; i < 4; ++i, in += BPS) {
    const int a0 = in[0] + in[2];
    const int a1 = in[1] + in[3];
    const int a2 = in[1] - in[3];
    const int a3 = in[0] - in[2];
    tmp[0 + i * 4] = a0 + a1;
    tmp[1 + i * 4] = a3 + a2;
    tmp[2 + i * 4] = a3 - a2;
    tmp[3 + i * 4] = a0 - a1;
  }
  // vertical pass
  for (i = 0; i < 4; ++i, ++w) {
    const int a0 = tmp[0 + i] + tmp[8 + i];
    const int a1 = tmp[4 + i] + tmp[12+ i];
    const int a2 = tmp[4 + i] - tmp[12+ i];
    const int a3 = tmp[0 + i] - tmp[8 + i];
    const int b0 = a0 + a1;
    const int b1 = a3 + a2;
    const int b2 = a3 - a2;
    const int b3 = a0 - a1;

    sum += w[ 0] * abs(b0);
    sum += w[ 4] * abs(b1);
    sum += w[ 8] * abs(b2);
    sum += w[12] * abs(b3);
  }
  return sum;
}